

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O3

TestInstance * __thiscall
vkt::sr::anon_unknown_0::TextureDerivateCase::createInstance
          (TextureDerivateCase *this,Context *context)

{
  deInt32 *pdVar1;
  pointer pPVar2;
  void *pvVar3;
  _func_int **pp_Var4;
  WrapMode WVar5;
  TriangleDerivateCaseInstance *this_00;
  Texture2D *pTVar6;
  TextureFormat this_01;
  FilterMode FVar7;
  long lVar8;
  int y;
  deUint32 internalFormat;
  int x;
  undefined1 auVar9 [16];
  float fVar10;
  undefined1 auVar11 [16];
  SharedPtr<vkt::sr::TextureBinding> testTexture;
  MovePtr<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> texture;
  PixelBufferAccess level0;
  undefined1 local_98 [8];
  undefined8 uStack_90;
  UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> local_88;
  TextureFormat local_78;
  WrapMode WStack_70;
  FilterMode FStack_6c;
  undefined8 local_68;
  bool local_60;
  CompareMode local_5c;
  int iStack_58;
  undefined1 auStack_54 [20];
  DepthStencilMode local_40;
  undefined1 local_38 [16];
  
  this_00 = (TriangleDerivateCaseInstance *)operator_new(0x228);
  TriangleDerivateCaseInstance::TriangleDerivateCaseInstance
            (this_00,context,
             (this->super_TriangleDerivateCase).super_ShaderRenderCase.m_uniformSetup.
             super_UniqueBase<const_vkt::sr::UniformSetup,_de::DefaultDeleter<const_vkt::sr::UniformSetup>_>
             .m_data.ptr,&(this->super_TriangleDerivateCase).m_definitions,
             &(this->super_TriangleDerivateCase).m_values);
  (this_00->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__ShaderRenderCaseInstance_00cf6870;
  this_00[1].super_ShaderRenderCaseInstance.super_TestInstance._vptr_TestInstance =
       (_func_int **)&(this->super_TriangleDerivateCase).field_0x13c;
  local_88.m_data.ptr = (Texture2D *)0x0;
  internalFormat = 0x881a;
  if (this_00->m_definitions->precision == PRECISION_HIGHP) {
    internalFormat = 0x8814;
  }
  local_98 = (undefined1  [8])glu::mapGLInternalFormat(internalFormat);
  pTVar6 = (Texture2D *)operator_new(0x50);
  tcu::Texture2D::Texture2D(pTVar6,(TextureFormat *)local_98,99,0x85);
  local_78.order = CLAMP_TO_EDGE;
  local_78.type = CLAMP_TO_EDGE;
  if (local_88.m_data.ptr != pTVar6) {
    de::details::UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::reset(&local_88);
    local_88.m_data.ptr = pTVar6;
  }
  de::details::UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::reset
            ((UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> *)&local_78);
  tcu::Texture2D::allocLevel(local_88.m_data.ptr,0);
  pPVar2 = ((local_88.m_data.ptr)->super_TextureLevelPyramid).m_access.
           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_78 = (pPVar2->super_ConstPixelBufferAccess).m_format;
  lVar8 = 2;
  do {
    (&((Sampler *)&local_78)->wrapS)[lVar8] =
         (pPVar2->super_ConstPixelBufferAccess).m_size.m_data[lVar8 + -2];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 5);
  lVar8 = 5;
  do {
    (&((Sampler *)&local_78)->wrapS)[lVar8] =
         (pPVar2->super_ConstPixelBufferAccess).m_size.m_data[lVar8 + -2];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 8);
  pvVar3 = (pPVar2->super_ConstPixelBufferAccess).m_data;
  iStack_58 = (int)pvVar3;
  auStack_54._0_4_ = (undefined4)((ulong)pvVar3 >> 0x20);
  if (0 < (int)FStack_6c) {
    y = 0;
    WVar5 = WStack_70;
    FVar7 = FStack_6c;
    do {
      if (0 < (int)WVar5) {
        local_38 = ZEXT416((uint)((float)y + 0.5));
        x = 0;
        do {
          auVar9._0_4_ = (float)x + 0.5;
          auVar9._4_4_ = local_38._0_4_;
          auVar9._8_4_ = 0;
          auVar9._12_4_ = local_38._4_4_;
          auVar11._0_4_ = (float)(int)WVar5;
          auVar11._4_4_ = (float)(int)FStack_6c;
          auVar11._8_8_ = 0;
          auVar9 = divps(auVar9,auVar11);
          fVar10 = (auVar9._4_4_ + auVar9._0_4_) * 0.5;
          pp_Var4 = this_00[1].super_ShaderRenderCaseInstance.super_TestInstance._vptr_TestInstance;
          local_98._4_4_ =
               (*(float *)((long)pp_Var4 + 0x14) - *(float *)((long)pp_Var4 + 4)) * auVar9._4_4_ +
               *(float *)((long)pp_Var4 + 4);
          local_98._0_4_ =
               (*(float *)(pp_Var4 + 2) - *(float *)pp_Var4) * auVar9._0_4_ + *(float *)pp_Var4;
          uStack_90 = (SharedPtrStateBase *)
                      CONCAT44((*(float *)((long)pp_Var4 + 0x1c) - *(float *)((long)pp_Var4 + 0xc))
                               * (1.0 - fVar10) + *(float *)((long)pp_Var4 + 0xc),
                               (*(float *)(pp_Var4 + 3) - *(float *)(pp_Var4 + 1)) * fVar10 +
                               *(float *)(pp_Var4 + 1));
          tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)&local_78,(Vec4 *)local_98,x,y,0);
          x = x + 1;
          WVar5 = WStack_70;
        } while (x < (int)WStack_70);
        FVar7 = FStack_6c;
      }
      y = y + 1;
    } while (y < (int)FVar7);
  }
  this_01 = (TextureFormat)operator_new(0x68);
  pTVar6 = local_88.m_data.ptr;
  local_88.m_data.ptr = (Texture2D *)0x0;
  local_68._0_4_ = NEAREST;
  local_68._4_4_ = 0.0;
  local_78.order = CLAMP_TO_EDGE;
  local_78.type = CLAMP_TO_EDGE;
  WStack_70 = CLAMP_TO_EDGE;
  FStack_6c = NEAREST;
  local_60 = true;
  local_40 = MODE_DEPTH;
  local_5c = COMPAREMODE_NONE;
  iStack_58 = 0;
  auStack_54._0_4_ = 0;
  auStack_54._4_4_ = 0;
  auStack_54[8] = 0;
  auStack_54._9_8_ = 0;
  TextureBinding::TextureBinding((TextureBinding *)this_01,pTVar6,(Sampler *)&local_78);
  uStack_90 = (SharedPtrStateBase *)0x0;
  local_98 = (undefined1  [8])this_01;
  uStack_90 = (SharedPtrStateBase *)operator_new(0x20);
  uStack_90->strongRefCount = 0;
  uStack_90->weakRefCount = 0;
  uStack_90->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00cf6920;
  uStack_90[1]._vptr_SharedPtrStateBase = (_func_int **)this_01;
  uStack_90->strongRefCount = 1;
  uStack_90->weakRefCount = 1;
  std::
  vector<de::SharedPtr<vkt::sr::TextureBinding>,_std::allocator<de::SharedPtr<vkt::sr::TextureBinding>_>_>
  ::push_back(&(this_00->super_ShaderRenderCaseInstance).m_textures,(value_type *)local_98);
  if (uStack_90 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &uStack_90->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_98._0_4_ = R;
      local_98._4_4_ = SNORM_INT8;
      (*uStack_90->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &uStack_90->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (uStack_90 != (SharedPtrStateBase *)0x0)) {
      (*uStack_90->_vptr_SharedPtrStateBase[1])();
    }
  }
  de::details::UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::reset(&local_88);
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* TextureDerivateCase::createInstance (Context& context) const
{
	DE_ASSERT(m_uniformSetup != DE_NULL);
	return new TextureDerivateCaseInstance(context, *m_uniformSetup, m_definitions, m_values, m_textureValues);
}